

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O2

uint64_t folder_uncompressed_size(_7z_folder *f)

{
  ulong *puVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = (ulong)(uint)f->numOutStreams;
  do {
    if ((int)uVar2 < 1) {
      return 0;
    }
    uVar2 = uVar2 - 1;
    lVar3 = 0;
    do {
      if ((ulong)(uint)f->numBindPairs * 0x10 + 0x10 == lVar3 + 0x10) {
        return f->unPackSize[uVar2 & 0xffffffff];
      }
      puVar1 = (ulong *)((long)&f->bindPairs->outIndex + lVar3);
      lVar3 = lVar3 + 0x10;
    } while (*puVar1 != uVar2);
  } while( true );
}

Assistant:

static uint64_t
folder_uncompressed_size(struct _7z_folder *f)
{
	int n = (int)f->numOutStreams;
	unsigned pairs = (unsigned)f->numBindPairs;

	while (--n >= 0) {
		unsigned i;
		for (i = 0; i < pairs; i++) {
			if (f->bindPairs[i].outIndex == (uint64_t)n)
				break;
		}
		if (i >= pairs)
			return (f->unPackSize[n]);
	}
	return (0);
}